

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

float * stbir_resize_float_linear
                  (float *input_pixels,int input_w,int input_h,int input_stride_in_bytes,
                  float *output_pixels,int output_w,int output_h,int output_stride_in_bytes,
                  stbir_pixel_layout pixel_layout)

{
  int iVar1;
  float *local_138;
  float *local_130;
  int local_114;
  float *pfStack_110;
  int opitch;
  float *optr;
  STBIR_RESIZE resize;
  int output_w_local;
  float *output_pixels_local;
  int input_stride_in_bytes_local;
  int input_h_local;
  int input_w_local;
  float *input_pixels_local;
  
  resize.samplers._4_4_ = output_w;
  iVar1 = stbir__check_output_stuff
                    (&stack0xfffffffffffffef0,&local_114,output_pixels,4,output_w,output_h,
                     output_stride_in_bytes,
                     stbir__pixel_layout_convert_public_to_internal[pixel_layout]);
  if (iVar1 == 0) {
    input_pixels_local = (float *)0x0;
  }
  else {
    local_130 = output_pixels;
    if (pfStack_110 != (float *)0x0) {
      local_130 = pfStack_110;
    }
    stbir_resize_init((STBIR_RESIZE *)&optr,input_pixels,input_w,input_h,input_stride_in_bytes,
                      local_130,resize.samplers._4_4_,output_h,local_114,pixel_layout,
                      STBIR_TYPE_FLOAT);
    iVar1 = stbir_resize_extended((STBIR_RESIZE *)&optr);
    if (iVar1 == 0) {
      if (pfStack_110 != (float *)0x0) {
        free(pfStack_110);
      }
      input_pixels_local = (float *)0x0;
    }
    else {
      local_138 = output_pixels;
      if (pfStack_110 != (float *)0x0) {
        local_138 = pfStack_110;
      }
      input_pixels_local = local_138;
    }
  }
  return input_pixels_local;
}

Assistant:

STBIRDEF float * stbir_resize_float_linear( const float *input_pixels , int input_w , int input_h, int input_stride_in_bytes,
                                                  float *output_pixels, int output_w, int output_h, int output_stride_in_bytes,
                                                  stbir_pixel_layout pixel_layout )
{
  STBIR_RESIZE resize;
  float * optr;
  int opitch;

  if ( !stbir__check_output_stuff( (void**)&optr, &opitch, output_pixels, sizeof( float ), output_w, output_h, output_stride_in_bytes, stbir__pixel_layout_convert_public_to_internal[ pixel_layout ] ) )
    return 0;

  stbir_resize_init( &resize,
                     input_pixels,  input_w,  input_h,  input_stride_in_bytes,
                     (optr) ? optr : output_pixels, output_w, output_h, opitch,
                     pixel_layout, STBIR_TYPE_FLOAT );

  if ( !stbir_resize_extended( &resize ) )
  {
    if ( optr )
      STBIR_FREE( optr, 0 );
    return 0;
  }

  return (optr) ? optr : output_pixels;
}